

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::detail::SocketStream::SocketStream
          (SocketStream *this,socket_t sock,time_t read_timeout_sec,time_t read_timeout_usec,
          time_t write_timeout_sec,time_t write_timeout_usec)

{
  allocator_type local_3a;
  value_type local_39;
  time_t local_38;
  time_t write_timeout_usec_local;
  time_t write_timeout_sec_local;
  time_t read_timeout_usec_local;
  time_t read_timeout_sec_local;
  SocketStream *pSStack_10;
  socket_t sock_local;
  SocketStream *this_local;
  
  local_38 = write_timeout_usec;
  write_timeout_usec_local = write_timeout_sec;
  write_timeout_sec_local = read_timeout_usec;
  read_timeout_usec_local = read_timeout_sec;
  read_timeout_sec_local._4_4_ = sock;
  pSStack_10 = this;
  Stream::Stream(&this->super_Stream);
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__SocketStream_00277880;
  this->sock_ = read_timeout_sec_local._4_4_;
  this->read_timeout_sec_ = read_timeout_usec_local;
  this->read_timeout_usec_ = write_timeout_sec_local;
  this->write_timeout_sec_ = write_timeout_usec_local;
  this->write_timeout_usec_ = local_38;
  local_39 = '\0';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&this->read_buff_,0x1000,&local_39,&local_3a);
  std::allocator<char>::~allocator(&local_3a);
  this->read_buff_off_ = 0;
  this->read_buff_content_size_ = 0;
  return;
}

Assistant:

inline SocketStream::SocketStream(socket_t sock, time_t read_timeout_sec,
                                  time_t read_timeout_usec,
                                  time_t write_timeout_sec,
                                  time_t write_timeout_usec)
    : sock_(sock), read_timeout_sec_(read_timeout_sec),
      read_timeout_usec_(read_timeout_usec),
      write_timeout_sec_(write_timeout_sec),
      write_timeout_usec_(write_timeout_usec), read_buff_(read_buff_size_, 0) {}